

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O1

void __thiscall HDualRow::update_dual(HDualRow *this,double theta)

{
  int iVar1;
  int iVar2;
  HModel *pHVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined4 uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar7 = rdtsc();
  uVar10 = (undefined4)((ulong)uVar7 >> 0x20);
  auVar8._4_4_ = uVar10;
  auVar8._0_4_ = uVar10;
  auVar8._8_4_ = 0;
  auVar13._0_12_ = auVar8 << 0x20;
  auVar13._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0x15] =
       (auVar13._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
  pHVar3 = this->workModel;
  iVar1 = this->packCount;
  if (0 < (long)iVar1) {
    pdVar4 = (pHVar3->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      iVar2 = piVar5[lVar11];
      pdVar4[iVar2] = pdVar6[lVar11] * -theta + pdVar4[iVar2];
      lVar11 = lVar11 + 1;
    } while (iVar1 != lVar11);
  }
  uVar7 = rdtsc();
  uVar10 = (undefined4)((ulong)uVar7 >> 0x20);
  auVar9._4_4_ = uVar10;
  auVar9._0_4_ = uVar10;
  auVar9._8_4_ = 0;
  auVar12._0_12_ = auVar9 << 0x20;
  auVar12._12_4_ = 0x45300000;
  (pHVar3->timer).itemTicks[0x15] =
       (((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) -
       (pHVar3->timer).itemStart[0x15]) + (pHVar3->timer).itemTicks[0x15];
  return;
}

Assistant:

void HDualRow::update_dual(double theta) {
    workModel->timer.recordStart(HTICK_UPDATE_DUAL);
    double *workDual = workModel->getWorkDual();
    for (int i = 0; i < packCount; i++)
        workDual[packIndex[i]] -= theta * packValue[i];
    workModel->timer.recordFinish(HTICK_UPDATE_DUAL);
}